

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
wasm::read_file<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,wasm *this,string *filename,BinaryOption binary)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  Fatal *pFVar4;
  ulong uVar5;
  unsigned_long uVar6;
  size_type __n;
  streamoff sVar7;
  long lVar8;
  undefined1 auVar9 [16];
  size_t chars;
  __mbstate_t local_590;
  undefined4 local_588;
  allocator<char> local_582;
  undefined1 local_581;
  Fatal local_580;
  undefined1 local_3f8 [8];
  streampos insize;
  PathString local_260;
  _Ios_Openmode local_22c;
  string local_228 [4];
  openmode flags;
  ifstream infile;
  do_read_stdin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d;
  int local_1c;
  string *psStack_18;
  BinaryOption binary_local;
  string *filename_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  
  local_1c = (int)filename;
  psStack_18 = (string *)this;
  filename_local = __return_storage_ptr__;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                          "-");
  if (bVar1) {
    do_read_stdin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(__return_storage_ptr__,&local_1d);
  }
  else {
    bVar1 = isDebugEnabled("file");
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Loading \'");
      poVar3 = std::operator<<(poVar3,(string *)psStack_18);
      std::operator<<(poVar3,"\'...\n");
    }
    std::ifstream::ifstream(local_228);
    local_22c = _S_in;
    if (local_1c == 0) {
      std::operator|=(&local_22c,_S_bin);
    }
    Path::to_path(&local_260,psStack_18);
    std::ifstream::open(local_228,(_Ios_Openmode)&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    bVar2 = std::ifstream::is_open();
    if ((bVar2 & 1) == 0) {
      Fatal::Fatal((Fatal *)&insize._M_state);
      pFVar4 = Fatal::operator<<((Fatal *)&insize._M_state,(char (*) [17])"Failed opening \'");
      pFVar4 = Fatal::operator<<(pFVar4,psStack_18);
      Fatal::operator<<(pFVar4,(char (*) [2])0x2971b78);
      Fatal::~Fatal((Fatal *)&insize._M_state);
    }
    std::istream::seekg((long)local_228,_S_beg);
    auVar9 = std::istream::tellg();
    insize._M_off = auVar9._8_8_;
    local_3f8 = auVar9._0_8_;
    uVar5 = std::fpos::operator_cast_to_long((fpos *)local_3f8);
    uVar6 = std::numeric_limits<unsigned_long>::max();
    if (uVar6 <= uVar5) {
      Fatal::Fatal(&local_580);
      pFVar4 = Fatal::operator<<(&local_580,(char (*) [17])"Failed opening \'");
      pFVar4 = Fatal::operator<<(pFVar4,psStack_18);
      pFVar4 = Fatal::operator<<(pFVar4,(char (*) [26])"\': Input file too large: ");
      pFVar4 = Fatal::operator<<(pFVar4,(fpos<__mbstate_t> *)local_3f8);
      Fatal::operator<<(pFVar4,(char (*) [39])" bytes. Try rebuilding in 64-bit mode.");
      Fatal::~Fatal(&local_580);
    }
    local_581 = 0;
    __n = std::fpos::operator_cast_to_long((fpos *)local_3f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__n,'\0',&local_582);
    std::allocator<char>::~allocator(&local_582);
    sVar7 = std::fpos::operator_cast_to_long((fpos *)local_3f8);
    if (sVar7 != 0) {
      std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&chars,0);
      std::istream::seekg(local_228,chars,local_590);
      lVar8 = std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      std::fpos::operator_cast_to_long((fpos *)local_3f8);
      std::istream::read((char *)local_228,lVar8);
      if (local_1c == 1) {
        std::istream::gcount();
        std::__cxx11::string::resize((ulong)__return_storage_ptr__);
      }
    }
    local_581 = 1;
    local_588 = 1;
    std::ifstream::~ifstream(local_228);
  }
  return __return_storage_ptr__;
}

Assistant:

T wasm::read_file(const std::string& filename, Flags::BinaryOption binary) {
  if (filename == "-") {
    return do_read_stdin<T>{}();
  }
  BYN_TRACE("Loading '" << filename << "'...\n");
  std::ifstream infile;
  std::ios_base::openmode flags = std::ifstream::in;
  if (binary == Flags::Binary) {
    flags |= std::ifstream::binary;
  }
  infile.open(wasm::Path::to_path(filename), flags);
  if (!infile.is_open()) {
    Fatal() << "Failed opening '" << filename << "'";
  }
  infile.seekg(0, std::ios::end);
  std::streampos insize = infile.tellg();
  if (uint64_t(insize) >= std::numeric_limits<size_t>::max()) {
    // Building a 32-bit executable where size_t == 32 bits, we are not able to
    // create strings larger than 2^32 bytes in length, so must abort here.
    Fatal() << "Failed opening '" << filename
            << "': Input file too large: " << insize
            << " bytes. Try rebuilding in 64-bit mode.";
  }
  // Zero-initialize the string or vector with the expected size.
  T input(size_t(insize), '\0');
  if (size_t(insize) == 0) {
    return input;
  }
  infile.seekg(0);
  infile.read(&input[0], insize);
  if (binary == Flags::Text) {
    size_t chars = size_t(infile.gcount());
    // Truncate size to the number of ASCII characters actually read in text
    // mode (which is generally less than the number of bytes on Windows, if
    // \r\n line endings are present)
    input.resize(chars);
  }
  return input;
}